

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&,_const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&>
* __thiscall
Catch::
ExprLhs<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
::operator<(BinaryExpr<const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&,_const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&>
            *__return_storage_ptr__,
           ExprLhs<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
           *this,basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *rhs)

{
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *lhs;
  bool comparisonResult;
  StringRef local_30;
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *local_20;
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *rhs_local;
  ExprLhs<const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&>
  *this_local;
  
  local_20 = rhs;
  rhs_local = (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *)this;
  this_local = (ExprLhs<const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&>
                *)__return_storage_ptr__;
  comparisonResult =
       type_safe::operator<
                 (*(basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> **
                   )this,rhs);
  lhs = *(basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> **)this;
  StringRef::StringRef(&local_30,"<");
  BinaryExpr<const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&,_const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&>
  ::BinaryExpr(__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator < ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs < rhs), m_lhs, "<", rhs };
        }